

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

bool __thiscall tinygltf::SpotLight::operator==(SpotLight *this,SpotLight *other)

{
  bool bVar1;
  
  bVar1 = std::operator==(&(this->extensions)._M_t,&(other->extensions)._M_t);
  if (((bVar1) && (bVar1 = Equals(&this->extras,&other->extras), bVar1)) &&
     (ABS(other->innerConeAngle - this->innerConeAngle) < 1e-12)) {
    return ABS(other->outerConeAngle - this->outerConeAngle) < 1e-12;
  }
  return false;
}

Assistant:

bool SpotLight::operator==(const SpotLight &other) const {
  return this->extensions == other.extensions && this->extras == other.extras &&
         TINYGLTF_DOUBLE_EQUAL(this->innerConeAngle, other.innerConeAngle) &&
         TINYGLTF_DOUBLE_EQUAL(this->outerConeAngle, other.outerConeAngle);
}